

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O3

RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> * __thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::add
          (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this,int *key)

{
  int iVar1;
  int iVar2;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar3;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar4;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar5;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar6;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node_2;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node;
  WeightedGraphAdjSet<int,_int> local_a8;
  TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_> local_70;
  
  if (this->_root ==
      (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
       *)0x0) {
    pRVar5 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)operator_new(0x70);
    WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet(&local_a8);
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::TreeElement
              (&local_70,key,&local_a8);
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::RBTreeNode(pRVar5,&local_70);
    this->_root = pRVar5;
    local_70.value._vptr_WeightedGraphAdjSet = (_func_int **)&PTR__WeightedGraphAdjSet_0010c988;
    local_70.value._table._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010c9b8;
    pLVar6 = local_70.value._table._list._tail;
    while (pLVar4 = local_70.value._table._list._header,
          local_70.value._table._list._header != pLVar6) {
      pLVar3 = (local_70.value._table._list._header)->_next;
      if (pLVar3 != (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                     *)0x0) {
        (local_70.value._table._list._header)->_next = pLVar3->_next;
        (*pLVar3->_vptr_ListNode[1])(pLVar3);
        pLVar6 = local_70.value._table._list._tail;
      }
      if (pLVar3 == pLVar6) {
        local_70.value._table._list._tail = pLVar4;
        pLVar6 = pLVar4;
      }
      local_70.value._table._list._size = local_70.value._table._list._size - 1;
    }
    local_70.value._table._list._tail = local_70.value._table._list._header;
    local_70.value._table._list._size = 0;
    local_70.value._table._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010c9e8;
    if (local_70.value._table._list._header !=
        (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
         *)0x0) {
      (*(local_70.value._table._list._header)->_vptr_ListNode[1])
                (local_70.value._table._list._header);
    }
    local_70.value._table._list._header =
         (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
          *)0x0;
    local_70.value._table._list._tail =
         (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
          *)0x0;
    local_70.value._table._list._size = 0;
    local_a8._vptr_WeightedGraphAdjSet = (_func_int **)&PTR__WeightedGraphAdjSet_0010c988;
    local_a8._table._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010c9b8;
    pLVar6 = local_a8._table._list._tail;
    while (pLVar4 = local_a8._table._list._header, local_a8._table._list._header != pLVar6) {
      pLVar3 = (local_a8._table._list._header)->_next;
      if (pLVar3 != (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                     *)0x0) {
        (local_a8._table._list._header)->_next = pLVar3->_next;
        (*pLVar3->_vptr_ListNode[1])(pLVar3);
        pLVar6 = local_a8._table._list._tail;
      }
      if (pLVar3 == pLVar6) {
        local_a8._table._list._tail = pLVar4;
        pLVar6 = pLVar4;
      }
      local_a8._table._list._size = local_a8._table._list._size - 1;
    }
    local_a8._table._list._tail = local_a8._table._list._header;
    local_a8._table._list._size = 0;
    local_a8._table._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010c9e8;
    if (local_a8._table._list._header !=
        (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
         *)0x0) {
      (*(local_a8._table._list._header)->_vptr_ListNode[1])(local_a8._table._list._header);
    }
  }
  else {
    pRVar5 = this->_root;
    do {
      node = pRVar5;
      iVar1 = (node->element).key;
      if (iVar1 == *key) {
        return this;
      }
      pRVar5 = (&node->_left)[iVar1 <= *key];
    } while ((&node->_left)[iVar1 <= *key] !=
             (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)0x0);
    pRVar5 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)operator_new(0x70);
    WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet(&local_a8);
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::TreeElement
              (&local_70,key,&local_a8);
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::RBTreeNode(pRVar5,&local_70);
    local_70.value._vptr_WeightedGraphAdjSet = (_func_int **)&PTR__WeightedGraphAdjSet_0010c988;
    local_70.value._table._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010c9b8;
    pLVar6 = local_70.value._table._list._tail;
    while (pLVar4 = local_70.value._table._list._header,
          local_70.value._table._list._header != pLVar6) {
      pLVar3 = (local_70.value._table._list._header)->_next;
      if (pLVar3 != (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                     *)0x0) {
        (local_70.value._table._list._header)->_next = pLVar3->_next;
        (*pLVar3->_vptr_ListNode[1])(pLVar3);
        pLVar6 = local_70.value._table._list._tail;
      }
      if (pLVar3 == pLVar6) {
        local_70.value._table._list._tail = pLVar4;
        pLVar6 = pLVar4;
      }
      local_70.value._table._list._size = local_70.value._table._list._size - 1;
    }
    local_70.value._table._list._tail = local_70.value._table._list._header;
    local_70.value._table._list._size = 0;
    local_70.value._table._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010c9e8;
    if (local_70.value._table._list._header !=
        (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
         *)0x0) {
      (*(local_70.value._table._list._header)->_vptr_ListNode[1])
                (local_70.value._table._list._header);
    }
    local_70.value._table._list._header =
         (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
          *)0x0;
    local_70.value._table._list._tail =
         (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
          *)0x0;
    local_70.value._table._list._size = 0;
    local_a8._vptr_WeightedGraphAdjSet = (_func_int **)&PTR__WeightedGraphAdjSet_0010c988;
    local_a8._table._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010c9b8;
    pLVar6 = local_a8._table._list._tail;
    while (pLVar4 = local_a8._table._list._header, local_a8._table._list._header != pLVar6) {
      pLVar3 = (local_a8._table._list._header)->_next;
      if (pLVar3 != (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                     *)0x0) {
        (local_a8._table._list._header)->_next = pLVar3->_next;
        (*pLVar3->_vptr_ListNode[1])(pLVar3);
        pLVar6 = local_a8._table._list._tail;
      }
      if (pLVar3 == pLVar6) {
        local_a8._table._list._tail = pLVar4;
        pLVar6 = pLVar4;
      }
      local_a8._table._list._size = local_a8._table._list._size - 1;
    }
    local_a8._table._list._tail = local_a8._table._list._header;
    local_a8._table._list._size = 0;
    local_a8._table._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010c9e8;
    if (local_a8._table._list._header !=
        (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
         *)0x0) {
      (*(local_a8._table._list._header)->_vptr_ListNode[1])(local_a8._table._list._header);
    }
    iVar2 = *key;
    iVar1 = (node->element).key;
    (&node->_left)[iVar1 <= iVar2] = pRVar5;
    pRVar5->_parent = node;
    pRVar5->_is_left = iVar2 < iVar1;
    pRVar5->_is_red = true;
    do {
      node->node_count = node->node_count + 1;
      pRVar5 = _balance(this,node);
      node = pRVar5->_parent;
    } while (node != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                      *)0x0);
    if (this->_root->_is_red == true) {
      this->_root->_is_red = false;
    }
  }
  return this;
}

Assistant:

inline
    RBTree<Key, Value>& RBTree<Key, Value>::add(const Key &key){
        if (isEmpty()) {
            _root = new RBTreeNode<TreeElement<Key, Value>>(TreeElement<Key, Value>(key, Value()));
            return *this;
        }
        auto node = _root;
        auto parent = _root->parent();
        while (node != nullptr) {
            if (node->element.key == key) {
                return *this;
            }
            parent = node;
            if (key < node->element.key) {
                node = node->left();
            } else {
                node = node->right();
            }
        }
        node = new RBTreeNode<TreeElement<Key, Value>>(TreeElement<Key, Value>(key, Value()));
        if (key < parent->element.key) {
            parent->insertLeft(node, true);
        } else {
            parent->insertRight(node, true);
        }
        while (parent != nullptr) {
            parent->node_count++;
            parent = _balance(parent)->parent();
        }
        // reset the root's color
        if (_root->isRed()) {
            _root->flipColors();
        }
        return *this;
    }